

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::Text::~Text(Text *this)

{
  Text *this_local;
  
  ~Text(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~Text			(void) {}